

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void row_mt_sync_mem_alloc(AV1EncRowMultiThreadSync *row_mt_sync,AV1_COMMON *cm,int rows)

{
  pthread_mutex_t *ppVar1;
  ulong uVar2;
  pthread_cond_t *ppVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)rows;
  ppVar1 = (pthread_mutex_t *)aom_malloc(lVar5 * 0x28);
  row_mt_sync->mutex_ = ppVar1;
  if (ppVar1 == (pthread_mutex_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate row_mt_sync->mutex_");
    if (row_mt_sync->mutex_ != (pthread_mutex_t *)0x0) goto LAB_001b46bc;
  }
  else {
LAB_001b46bc:
    lVar6 = 0;
    uVar2 = 0;
    if (0 < rows) {
      uVar2 = (ulong)(uint)rows;
    }
    for (; uVar2 * 0x28 - lVar6 != 0; lVar6 = lVar6 + 0x28) {
      pthread_mutex_init((pthread_mutex_t *)((long)row_mt_sync->mutex_ + lVar6),
                         (pthread_mutexattr_t *)0x0);
    }
  }
  ppVar3 = (pthread_cond_t *)aom_malloc(lVar5 * 0x30);
  row_mt_sync->cond_ = ppVar3;
  if (ppVar3 == (pthread_cond_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate row_mt_sync->cond_");
    if (row_mt_sync->cond_ == (pthread_cond_t *)0x0) goto LAB_001b473d;
  }
  lVar6 = 0;
  uVar2 = 0;
  if (0 < rows) {
    uVar2 = (ulong)(uint)rows;
  }
  for (; uVar2 * 0x30 - lVar6 != 0; lVar6 = lVar6 + 0x30) {
    pthread_cond_init((pthread_cond_t *)((long)row_mt_sync->cond_ + lVar6),(pthread_condattr_t *)0x0
                     );
  }
LAB_001b473d:
  piVar4 = (int *)aom_malloc(lVar5 << 2);
  row_mt_sync->num_finished_cols = piVar4;
  if (piVar4 == (int *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate row_mt_sync->num_finished_cols");
  }
  row_mt_sync->rows = rows;
  row_mt_sync->sync_range = 1;
  return;
}

Assistant:

static void row_mt_sync_mem_alloc(AV1EncRowMultiThreadSync *row_mt_sync,
                                  AV1_COMMON *cm, int rows) {
#if CONFIG_MULTITHREAD
  int i;

  CHECK_MEM_ERROR(cm, row_mt_sync->mutex_,
                  aom_malloc(sizeof(*row_mt_sync->mutex_) * rows));
  if (row_mt_sync->mutex_) {
    for (i = 0; i < rows; ++i) {
      pthread_mutex_init(&row_mt_sync->mutex_[i], NULL);
    }
  }

  CHECK_MEM_ERROR(cm, row_mt_sync->cond_,
                  aom_malloc(sizeof(*row_mt_sync->cond_) * rows));
  if (row_mt_sync->cond_) {
    for (i = 0; i < rows; ++i) {
      pthread_cond_init(&row_mt_sync->cond_[i], NULL);
    }
  }
#endif  // CONFIG_MULTITHREAD

  CHECK_MEM_ERROR(cm, row_mt_sync->num_finished_cols,
                  aom_malloc(sizeof(*row_mt_sync->num_finished_cols) * rows));

  row_mt_sync->rows = rows;
  // Set up nsync.
  row_mt_sync->sync_range = 1;
}